

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void helics::setIterationFlags(ActionMessage *command,IterationRequest iterate)

{
  undefined1 in_SIL;
  ActionMessage *in_RDI;
  
  switch(in_SIL) {
  case 0:
  default:
    break;
  case 1:
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RDI,iteration_requested_flag);
    setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(in_RDI,required_flag);
    break;
  case 2:
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RDI,iteration_requested_flag);
    break;
  case 7:
    setActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RDI,error_flag);
  }
  return;
}

Assistant:

void setIterationFlags(ActionMessage& command, IterationRequest iterate)
{
    switch (iterate) {
        case IterationRequest::FORCE_ITERATION:
            setActionFlag(command, iteration_requested_flag);
            setActionFlag(command, required_flag);
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
            setActionFlag(command, iteration_requested_flag);
            break;
        case IterationRequest::ERROR_CONDITION:
            setActionFlag(command, error_flag);
            break;
        case IterationRequest::NO_ITERATIONS:
        default:
            break;
    }
}